

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundMap.cpp
# Opt level: O0

void AI::writeCell(Cell *cell,Vector2<int> gridCoordinates,float currentIntensity,
                  SoundSource *source)

{
  int local_30;
  int waveId;
  SoundSource *source_local;
  float currentIntensity_local;
  Cell *cell_local;
  Vector2<int> gridCoordinates_local;
  
  if (cell->numberOfWaves < 10) {
    local_30 = cell->numberOfWaves;
  }
  else {
    local_30 = 10;
  }
  cell->intersectingWaves[local_30].gridCoordinates = gridCoordinates;
  cell->intersectingWaves[local_30].intensity = currentIntensity;
  cell->intersectingWaves[local_30].id = source->id;
  cell->intersectingWaves[local_30].tag = source->tag;
  cell->intersectingWaves[local_30].originalPosition = source->originalPosition;
  cell->numberOfWaves = cell->numberOfWaves + 1;
  return;
}

Assistant:

inline void writeCell(Cell& cell, Vector2<int> gridCoordinates, float currentIntensity, const SoundSource& source)
	{
		int waveId = cell.numberOfWaves < Cell::MaxIntersectingWaves ? cell.numberOfWaves : Cell::MaxIntersectingWaves; 
		cell.intersectingWaves[waveId].gridCoordinates = gridCoordinates;
		cell.intersectingWaves[waveId].intensity = currentIntensity;
		cell.intersectingWaves[waveId].id = source.id;
		cell.intersectingWaves[waveId].tag = source.tag;
		cell.intersectingWaves[waveId].originalPosition = source.originalPosition;
		cell.numberOfWaves++;
	}